

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall
mjs::property_name_and_value::property_name_and_value
          (property_name_and_value *this,property_assignment_type type,expression_ptr *name,
          expression_ptr *value)

{
  expression *peVar1;
  int iVar2;
  pointer *__ptr;
  
  this->type_ = type;
  (this->name_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (name->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (name->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  (this->value_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (value->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (value->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  peVar1 = (this->name_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if ((peVar1 == (expression *)0x0) ||
     ((this->value_)._M_t.
      super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
      super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == (expression *)0x0)) {
    __assert_fail("name_ && value_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x105,
                  "mjs::property_name_and_value::property_name_and_value(property_assignment_type, expression_ptr &&, expression_ptr &&)"
                 );
  }
  iVar2 = (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x18))(peVar1);
  if (iVar2 != 0) {
    iVar2 = (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x18))(peVar1);
    if ((iVar2 != 2) || (1 < *(int *)&peVar1[1].super_syntax_node._vptr_syntax_node - 3U)) {
      __assert_fail("is_valid_property_name_expression(*name_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h"
                    ,0x106,
                    "mjs::property_name_and_value::property_name_and_value(property_assignment_type, expression_ptr &&, expression_ptr &&)"
                   );
    }
  }
  if (type != normal) {
    iVar2 = (**(code **)((long)(((this->value_)._M_t.
                                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                                 .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl)->
                               super_syntax_node)._vptr_syntax_node + 0x18))();
    if (iVar2 != 0xb) {
      __assert_fail("type == property_assignment_type::normal || value_->type() == expression_type::function"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h"
                    ,0x107,
                    "mjs::property_name_and_value::property_name_and_value(property_assignment_type, expression_ptr &&, expression_ptr &&)"
                   );
    }
  }
  return;
}

Assistant:

explicit property_name_and_value(property_assignment_type type, expression_ptr&& name, expression_ptr&& value)
        : type_{type}
        , name_{std::move(name)}
        , value_{std::move(value)} {
        assert(name_ && value_);
        assert(is_valid_property_name_expression(*name_));
        assert(type == property_assignment_type::normal || value_->type() == expression_type::function);
    }